

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  undefined1 local_68 [8];
  string dot_extension;
  long local_40;
  long local_38 [2];
  
  dot_extension.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&dot_extension.field_2 + 8),".","");
  plVar3 = (long *)std::__cxx11::string::append(dot_extension.field_2._M_local_buf + 8);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    dot_extension._M_string_length = *psVar4;
    dot_extension.field_2._M_allocated_capacity = plVar3[3];
    local_68 = (undefined1  [8])&dot_extension._M_string_length;
  }
  else {
    dot_extension._M_string_length = *psVar4;
    local_68 = (undefined1  [8])*plVar3;
  }
  dot_extension._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((long *)dot_extension.field_2._8_8_ != local_38) {
    operator_delete((void *)dot_extension.field_2._8_8_,local_38[0] + 1);
  }
  bVar2 = String::EndsWithCaseInsensitive(&this->pathname_,(string *)local_68);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)((long)&dot_extension.field_2 + 8),(ulong)this);
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,dot_extension.field_2._8_8_,
               local_40 + dot_extension.field_2._8_8_);
    Normalize(__return_storage_ptr__);
    if ((long *)dot_extension.field_2._8_8_ != local_38) {
      operator_delete((void *)dot_extension.field_2._8_8_,local_38[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->pathname_)._M_string_length);
  }
  if (local_68 != (undefined1  [8])&dot_extension._M_string_length) {
    operator_delete((void *)local_68,dot_extension._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}